

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl_dispatch_test.cc
# Opt level: O2

void __thiscall
ImplDispatchTest_AES_set_encrypt_key_Test::TestBody(ImplDispatchTest_AES_set_encrypt_key_Test *this)

{
  initializer_list<std::pair<unsigned_long,_bool>_> __l;
  allocator_type local_71;
  _Vector_base<std::pair<unsigned_long,_bool>,_std::allocator<std::pair<unsigned_long,_bool>_>_>
  local_70;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  pair<unsigned_long,_bool> local_30;
  undefined8 local_20;
  byte local_18;
  
  local_30.first = 3;
  local_30.second = (this->super_ImplDispatchTest).aesni_;
  local_18 = 0;
  if ((this->super_ImplDispatchTest).ssse3_ != false) {
    local_18 = local_30.second ^ 1;
  }
  local_20 = 5;
  __l._M_len = 2;
  __l._M_array = &local_30;
  std::vector<std::pair<unsigned_long,_bool>,_std::allocator<std::pair<unsigned_long,_bool>_>_>::
  vector((vector<std::pair<unsigned_long,_bool>,_std::allocator<std::pair<unsigned_long,_bool>_>_> *
         )&local_70,__l,&local_71);
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_40 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/impl_dispatch_test.cc:138:7)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/impl_dispatch_test.cc:138:7)>
             ::_M_manager;
  ImplDispatchTest::AssertFunctionsHit
            (&this->super_ImplDispatchTest,
             (vector<std::pair<unsigned_long,_bool>,_std::allocator<std::pair<unsigned_long,_bool>_>_>
              *)&local_70,(function<void_()> *)&local_58);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  std::
  _Vector_base<std::pair<unsigned_long,_bool>,_std::allocator<std::pair<unsigned_long,_bool>_>_>::
  ~_Vector_base(&local_70);
  return;
}

Assistant:

TEST_F(ImplDispatchTest, AES_set_encrypt_key) {
  AssertFunctionsHit(
      {
          {kFlag_aes_hw_set_encrypt_key, aesni_},
          {kFlag_vpaes_set_encrypt_key, ssse3_ && !aesni_},
      },
      [] {
        AES_KEY key;
        static const uint8_t kZeros[16] = {0};
        AES_set_encrypt_key(kZeros, sizeof(kZeros) * 8, &key);
      });
}